

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_object_propertyIsEnumerable(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v;
  JSValue val;
  JSValue JVar1;
  int iVar2;
  JSAtom JVar3;
  undefined4 in_ECX;
  int64_t in_RSI;
  JSValueUnion in_RDI;
  JSValue JVar4;
  int has_prop;
  JSPropertyDescriptor desc;
  JSObject *in_stack_00000078;
  JSAtom prop;
  JSValue obj;
  JSValue res;
  undefined4 in_stack_ffffffffffffff18;
  JSAtom in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  JSValueUnion in_stack_ffffffffffffff28;
  JSValueUnion in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uint in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffffb0;
  JSValueUnion local_30;
  int64_t local_28;
  undefined4 uStack_c;
  
  local_30.float64 = 0.0;
  local_28 = 6;
  JVar4.tag = in_RSI;
  JVar4.u.float64 = in_RDI.float64;
  JVar4 = JS_ToObject((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffffb0),JVar4);
  iVar2 = JS_IsException(JVar4);
  if (((iVar2 == 0) &&
      (val.u._4_4_ = in_stack_ffffffffffffff54, val.u.int32 = in_stack_ffffffffffffff50,
      val.tag._0_4_ = in_stack_ffffffffffffff58, val.tag._4_4_ = in_stack_ffffffffffffff5c,
      JVar3 = JS_ValueToAtom((JSContext *)JVar4.tag,val), JVar3 != 0)) &&
     (iVar2 = JS_GetOwnPropertyInternal
                        ((JSContext *)obj.tag,(JSPropertyDescriptor *)obj.u.ptr,in_stack_00000078,
                         desc.setter.tag._4_4_), -1 < iVar2)) {
    if (iVar2 == 0) {
      in_stack_ffffffffffffff20 = 0;
      in_stack_ffffffffffffff28.float64 = 4.94065645841247e-324;
      local_30.ptr = (void *)((ulong)in_stack_ffffffffffffff24 << 0x20);
    }
    else {
      local_30.int32._1_3_ = 0;
      local_30.int32._0_1_ = (in_stack_ffffffffffffff58 & 4) != 0;
      local_30._4_4_ = uStack_c;
      in_stack_ffffffffffffff30 = local_30;
      js_free_desc((JSContext *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   (JSPropertyDescriptor *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    }
    local_28 = 1;
  }
  JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
              in_stack_ffffffffffffff1c);
  v.tag = (int64_t)in_stack_ffffffffffffff30.ptr;
  v.u.float64 = in_stack_ffffffffffffff28.float64;
  JS_FreeValue((JSContext *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),v);
  JVar1.tag = local_28;
  JVar1.u.float64 = local_30.float64;
  return JVar1;
}

Assistant:

static JSValue js_object_propertyIsEnumerable(JSContext *ctx, JSValueConst this_val,
                                              int argc, JSValueConst *argv)
{
    JSValue obj, res = JS_EXCEPTION;
    JSAtom prop = JS_ATOM_NULL;
    JSPropertyDescriptor desc;
    int has_prop;

    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj))
        goto exception;
    prop = JS_ValueToAtom(ctx, argv[0]);
    if (unlikely(prop == JS_ATOM_NULL))
        goto exception;

    has_prop = JS_GetOwnPropertyInternal(ctx, &desc, JS_VALUE_GET_OBJ(obj), prop);
    if (has_prop < 0)
        goto exception;
    if (has_prop) {
        res = JS_NewBool(ctx, (desc.flags & JS_PROP_ENUMERABLE) != 0);
        js_free_desc(ctx, &desc);
    } else {
        res = JS_FALSE;
    }

exception:
    JS_FreeAtom(ctx, prop);
    JS_FreeValue(ctx, obj);
    return res;
}